

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

ReadFileResult __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::
operator()(Object<cmCMakePresetsGraph::TestPreset> *this,TestPreset *out,Value *value)

{
  bool bVar1;
  ReadFileResult RVar2;
  const_pointer pvVar3;
  size_type sVar4;
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset_&,_const_Json::Value_*)>
  *this_00;
  Value *__args_1;
  iterator __first;
  iterator __last;
  ReadFileResult local_150;
  ReadFileResult result_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  const_iterator local_c0;
  int local_b4;
  ReadFileResult local_b0;
  allocator local_a9;
  ReadFileResult result;
  string name;
  Member *m;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>
  *__range3;
  Members local_58;
  undefined1 local_40 [8];
  Members extraFields;
  Value *value_local;
  TestPreset *out_local;
  Object<cmCMakePresetsGraph::TestPreset> *this_local;
  
  if ((value == (Value *)0x0) && ((this->AnyRequired & 1U) != 0)) {
    this_local._4_4_ = this->Fail;
  }
  else {
    extraFields.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)value;
    if ((value == (Value *)0x0) || (bVar1 = Json::Value::isObject(value), bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40);
      if (extraFields.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        Json::Value::getMemberNames_abi_cxx11_
                  (&local_58,
                   (Value *)extraFields.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40,&local_58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_58);
      }
      __end0 = std::
               vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>
               ::begin(&this->Members);
      m = (Member *)
          std::
          vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>
          ::end(&this->Members);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<const_cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member_*,_std::vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>_>
                                         *)&m), bVar1) {
        name.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member_*,_std::vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>_>
             ::operator*(&__end0);
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)name.field_2._8_8_);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)name.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&result,pvVar3,sVar4,&local_a9);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        if ((extraFields.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) ||
           (bVar1 = Json::Value::isMember
                              ((Value *)extraFields.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (String *)&result), !bVar1)) {
          if ((*(byte *)(name.field_2._8_8_ + 0x30) & 1) == 0) {
            RVar2 = std::
                    function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset_&,_const_Json::Value_*)>
                    ::operator()((function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset_&,_const_Json::Value_*)>
                                  *)(name.field_2._8_8_ + 0x10),out,(Value *)0x0);
            if (RVar2 == this->Success) goto LAB_005d3085;
            local_b4 = 1;
            this_local._4_4_ = RVar2;
          }
          else {
            this_local._4_4_ = this->Fail;
            local_b4 = 1;
          }
        }
        else {
          this_00 = (function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset_&,_const_Json::Value_*)>
                     *)(name.field_2._8_8_ + 0x10);
          __args_1 = Json::Value::operator[]
                               ((Value *)extraFields.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (String *)&result);
          local_b0 = std::
                     function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::TestPreset_&,_const_Json::Value_*)>
                     ::operator()(this_00,out,__args_1);
          if (local_b0 == this->Success) {
            __first = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40);
            __last = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_40);
            local_c8 = std::
                       find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                 (__first._M_current,__last._M_current,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&result);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_c0,&local_c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40,local_c0);
LAB_005d3085:
            local_b4 = 0;
          }
          else {
            local_b4 = 1;
            this_local._4_4_ = local_b0;
          }
        }
        std::__cxx11::string::~string((string *)&result);
        if (local_b4 != 0) goto LAB_005d3108;
        __gnu_cxx::
        __normal_iterator<const_cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member_*,_std::vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::TestPreset>::Member>_>_>
        ::operator++(&__end0);
      }
      if (((this->AllowExtra & 1U) != 0) ||
         (bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_40), bVar1)) {
        local_150 = this->Success;
      }
      else {
        local_150 = this->Fail;
      }
      this_local._4_4_ = local_150;
      local_b4 = 1;
LAB_005d3108:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
    }
    else {
      this_local._4_4_ = this->Fail;
    }
  }
  return this_local._4_4_;
}

Assistant:

E operator()(T& out, const Json::Value* value, CallState&&... state) const
    {
      if (!value && this->AnyRequired) {
        return this->Fail;
      }
      if (value && !value->isObject()) {
        return this->Fail;
      }
      Json::Value::Members extraFields;
      if (value) {
        extraFields = value->getMemberNames();
      }

      for (auto const& m : this->Members) {
        std::string name(m.Name.data(), m.Name.size());
        if (value && value->isMember(name)) {
          E result = m.Function(out, &(*value)[name], std::forward(state)...);
          if (result != this->Success) {
            return result;
          }
          extraFields.erase(
            std::find(extraFields.begin(), extraFields.end(), name));
        } else if (!m.Required) {
          E result = m.Function(out, nullptr, std::forward(state)...);
          if (result != this->Success) {
            return result;
          }
        } else {
          return this->Fail;
        }
      }

      return this->AllowExtra || extraFields.empty() ? this->Success
                                                     : this->Fail;
    }